

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          FixedArray<char,_1UL> *params_5)

{
  long lVar1;
  char *target;
  long lVar2;
  long lVar3;
  long local_60 [6];
  
  local_60[0] = *(long *)(this + 8);
  local_60[1] = params->size_;
  local_60[2] = params_1->size_;
  local_60[3] = params_2->size_;
  local_60[4] = params_3->size_;
  local_60[5] = 1;
  lVar2 = 0;
  lVar3 = 0;
  lVar1 = 0;
  do {
    lVar2 = lVar2 + local_60[lVar1];
    lVar3 = lVar3 + local_60[lVar1 + 1];
    lVar1 = lVar1 + 2;
  } while (lVar1 != 6);
  heapString(__return_storage_ptr__,lVar3 + lVar2);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)this;
    lVar3 = 0;
    do {
      target[lVar3] = *(char *)(lVar2 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    target = target + lVar3;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (target,params,params_1,params_2,params_3,(FixedArray<char,_1UL> *)params_4);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}